

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> this_01;
  ScopePushPop __s;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  uint uVar8;
  char *pcVar9;
  pointer filename_00;
  allocator<char> local_4c1;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  string local_4a8;
  ScopePushPop pp;
  string hashFile;
  ostringstream cmCPackLog_msg;
  uint auStack_420 [120];
  string filename;
  ostringstream cmCPackLog_msg_15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [22];
  string findExpr;
  Glob gl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Create package using ");
  poVar5 = std::operator<<(poVar5,(string *)&this->Name);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3bd,_cmCPackLog_msg_15);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar4 = PrepareNames(this);
  if (iVar4 == 0) {
    return 0;
  }
  iVar4 = (*this->_vptr_cmCPackGenerator[6])(this);
  if (iVar4 == 0) {
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",
             (allocator<char> *)&cmCPackLog_msg_15);
  pcVar6 = GetOption(this,(string *)&cmCPackLog_msg);
  bVar3 = cmSystemTools::IsOn(pcVar6);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&cmCPackLog_msg_15);
    pcVar6 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    bVar3 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Remove toplevel directory: ");
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3d1,_cmCPackLog_msg_15);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,pcVar6,(allocator<char> *)&cmCPackLog_msg_15);
      bVar3 = cmSystemTools::RepeatedRemoveDirectory((string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem removing toplevel directory: ")
        ;
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3d5,_cmCPackLog_msg_15);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        return 0;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"About to install project ");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3db,_cmCPackLog_msg_15);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar4 = InstallProject(this);
  if (iVar4 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Done install project ");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3e0,_cmCPackLog_msg_15);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)&cmCPackLog_msg_15);
  pcVar6 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",
             (allocator<char> *)&cmCPackLog_msg_15);
  pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Find files");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3e6,_cmCPackLog_msg_15);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  cmsys::Glob::Glob(&gl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&findExpr,pcVar7,(allocator<char> *)&cmCPackLog_msg);
  std::__cxx11::string::append((char *)&findExpr);
  gl.Recurse = true;
  gl.RecurseListDirs = true;
  gl.RecurseThroughSymlinks = false;
  bVar3 = cmsys::Glob::FindFiles(&gl,&findExpr,(GlobMessages *)0x0);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Create package");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3f3,_cmCPackLog_msg_15);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Package files to: ");
    pcVar7 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar7 = "(NULL)";
    }
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3f7,_cmCPackLog_msg_15);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    bVar3 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Remove old package file");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3fa,_cmCPackLog_msg_15);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,pcVar6,(allocator<char> *)&cmCPackLog_msg_15);
      cmsys::SystemTools::RemoveFile((string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&cmCPackLog_msg_15);
    pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
    bVar3 = cmSystemTools::IsOn(pcVar7);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",
                 (allocator<char> *)&cmCPackLog_msg_15);
      GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    __x = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->packageFileNames);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    _cmCPackLog_msg = pcVar6;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->packageFileNames,(char **)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&this->toplevel);
    pp.Makefile = this->MakefileMap;
    cmMakefile::PushScope(pp.Makefile);
    this_00 = this->MakefileMap;
    pcVar6 = cmVersion::GetCMakeVersion();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar6,(allocator<char> *)&filename);
    _cmCPackLog_msg_15 = (pointer)local_210;
    local_210[0]._M_local_buf[0] = '\0';
    cmMakefile::SetPolicyVersion(this_00,(string *)&cmCPackLog_msg,(string *)&cmCPackLog_msg_15);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    iVar4 = (*this->_vptr_cmCPackGenerator[9])();
    if ((iVar4 != 0) && (bVar3 = cmSystemTools::GetErrorOccuredFlag(), !bVar3)) {
      cmMakefile::ScopePushPop::~ScopePushPop(&pp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_CHECKSUM",
                 (allocator<char> *)&cmCPackLog_msg_15);
      pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      pcVar6 = "";
      if (pcVar7 != (char *)0x0) {
        pcVar6 = pcVar7;
      }
      cmCryptoHash::New((cmCryptoHash *)&crypto,pcVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Copying final package(s) [");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"]:");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x427,_cmCPackLog_msg_15);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      pbVar2 = (this->packageFileNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (filename_00 = (this->packageFileNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; filename_00 != pbVar2;
          filename_00 = filename_00 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",
                   (allocator<char> *)&cmCPackLog_msg_15);
        pcVar6 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pp,pcVar6,(allocator<char> *)&filename);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        cmsys::SystemTools::GetFilenameName(&filename,filename_00);
        pcVar6 = (filename_00->_M_dataplus)._M_p;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,"/",&filename);
        std::__cxx11::string::append((string *)&pp);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        __s = pp;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Copy final package(s): ");
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "(NULL)";
        }
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5," to ");
        pcVar9 = (char *)__s;
        if (__s.Makefile == (cmMakefile *)0x0) {
          pcVar9 = "(NULL)";
        }
        poVar5 = std::operator<<(poVar5,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x433,_cmCPackLog_msg_15);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        bVar3 = cmsys::SystemTools::CopyFileIfDifferent(filename_00,(string *)&pp);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem copying the package: ");
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5," to ");
          poVar5 = std::operator<<(poVar5,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x439,_cmCPackLog_msg_15);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_001486c5:
          std::__cxx11::string::~string((string *)&filename);
          std::__cxx11::string::~string((string *)&pp);
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"- package: ");
        poVar5 = std::operator<<(poVar5,(char *)__s.Makefile);
        poVar5 = std::operator<<(poVar5," generated.");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x43e,_cmCPackLog_msg_15);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        if ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
            crypto._M_t.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t
            .super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
            super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",
                     (allocator<char> *)&cmCPackLog_msg_15);
          pcVar6 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cmCPackLog_msg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hashFile,pcVar6,(allocator<char> *)&local_4a8);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,"/",&filename);
          std::__cxx11::string::append((string *)&hashFile);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,pcVar7,&local_4c1)
          ;
          cmsys::SystemTools::LowerCase((string *)&cmCPackLog_msg_15,&local_4a8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,".",(string *)&cmCPackLog_msg_15);
          std::__cxx11::string::append((string *)&hashFile);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::ofstream::ofstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg,hashFile._M_dataplus._M_p,_S_out);
          this_01 = crypto;
          uVar8 = *(uint *)((long)auStack_420 + *(long *)(_cmCPackLog_msg + -0x18));
          if ((uVar8 & 5) == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4a8,(char *)__s.Makefile,&local_4c1);
            cmCryptoHash::HashFile
                      ((string *)&cmCPackLog_msg_15,
                       (cmCryptoHash *)
                       this_01._M_t.
                       super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
                       super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                       super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl,&local_4a8);
            poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,(string *)&cmCPackLog_msg_15);
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)&filename);
            std::operator<<(poVar5,"\n");
            std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_15);
            poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_15,"- checksum file: ");
            poVar5 = std::operator<<(poVar5,(string *)&hashFile);
            poVar5 = std::operator<<(poVar5," generated.");
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x44f,local_4a8._M_dataplus._M_p);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_15);
            poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_15,"Cannot create checksum file: ");
            poVar5 = std::operator<<(poVar5,(string *)&hashFile);
            std::endl<char,std::char_traits<char>>(poVar5);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x449,local_4a8._M_dataplus._M_p);
          }
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_15);
          std::ofstream::~ofstream(&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&hashFile);
          if ((uVar8 & 5) != 0) goto LAB_001486c5;
        }
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&pp);
      }
      uVar8 = (uint)(filename_00 == pbVar2);
      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr(&crypto);
      goto LAB_00147fb2;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem compressing the directory");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x416,_cmCPackLog_msg_15);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cmMakefile::ScopePushPop::~ScopePushPop(&pp);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find any files in the packaging tree");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3ef,_cmCPackLog_msg_15);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  }
  uVar8 = 0;
LAB_00147fb2:
  std::__cxx11::string::~string((string *)&findExpr);
  cmsys::Glob::~Glob(&gl);
  return uVar8;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    const char* toplevelDirectory =
      this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  const char* tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.emplace_back(tempPackageFileName ? tempPackageFileName
                                                    : "");
  toplevel = tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }

  /* Prepare checksum algorithm*/
  const char* algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(algo ? algo : "");

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = pkgFileName.c_str();
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}